

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O0

QString * QMakeInternal::IoUtils::resolvePath(QString *baseDir,QString *fileName)

{
  bool bVar1;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_const_QString_&> *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_QLatin1Char> QVar2;
  QStringBuilder<const_QString_&,_QLatin1Char> *a;
  QString *a_00;
  QStringBuilder<const_QString_&,_QLatin1Char> local_49;
  QString *local_30;
  char local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a_00 = in_RDI;
  bVar1 = QString::isEmpty((QString *)0x2c33e2);
  if (bVar1) {
    QString::QString((QString *)0x2c33f2);
  }
  else {
    bVar1 = isAbsolutePath((QString *)0x2c3401);
    if (bVar1) {
      QDir::cleanPath((QString *)a_00);
    }
    else {
      a = &local_49;
      QLatin1Char::QLatin1Char((QLatin1Char *)a,'/');
      QVar2 = ::operator+(a_00,(QLatin1Char *)a);
      local_30 = QVar2.a;
      local_28 = (char)QVar2.b.ch;
      ::operator+(a,(QString *)in_RSI);
      ::QStringBuilder::operator_cast_to_QString(in_RSI);
      QDir::cleanPath((QString *)a_00);
      QString::~QString((QString *)0x2c349d);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString IoUtils::resolvePath(const QString &baseDir, const QString &fileName)
{
    if (fileName.isEmpty())
        return QString();
    if (isAbsolutePath(fileName))
        return QDir::cleanPath(fileName);
#ifdef Q_OS_WIN // Add drive to otherwise-absolute path:
    if (fileName.at(0).unicode() == '/' || fileName.at(0).unicode() == '\\') {
        Q_ASSERT_X(isAbsolutePath(baseDir), "IoUtils::resolvePath", qUtf8Printable(baseDir));
        return QDir::cleanPath(baseDir.left(2) + fileName);
    }
#endif // Q_OS_WIN
    return QDir::cleanPath(baseDir + QLatin1Char('/') + fileName);
}